

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actorptrselect.cpp
# Opt level: O0

AActor * COPY_AAPTR(AActor *origin,int selector)

{
  uint uVar1;
  AActor *pAVar2;
  AActor *local_a8;
  AActor *local_a0;
  AActor *local_98;
  AActor *local_90;
  AActor *local_88;
  AActor *local_80;
  AActor *local_78;
  AActor *local_70;
  AActor *local_60;
  AActor *local_58;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  FTranslatedLineTarget t;
  int selector_local;
  AActor *origin_local;
  
  if (selector == 0) {
    return origin;
  }
  t._20_4_ = selector;
  FTranslatedLineTarget::FTranslatedLineTarget((FTranslatedLineTarget *)local_38);
  if (origin != (AActor *)0x0) {
    if (origin->player != (player_t *)0x0) {
      if ((t._20_4_ & 0x30) == 0x10) {
        P_BulletSlope((AActor *)(local_48 + 8),(FTranslatedLineTarget *)origin,(int)local_38);
        return (AActor *)local_38;
      }
      if ((t._20_4_ & 0x30) == 0x20) {
        pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&origin->player->ConversationNPC);
        return pAVar2;
      }
    }
    uVar1 = t._20_4_ & 0xc00e;
    if (uVar1 == 2) {
      pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&origin->target);
      return pAVar2;
    }
    if (uVar1 == 4) {
      pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&origin->master);
      return pAVar2;
    }
    if (uVar1 == 8) {
      pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&origin->tracer);
      return pAVar2;
    }
    if (uVar1 == 0x4000) {
      if (origin->FriendPlayer == '\0') {
        local_60 = (AActor *)0x0;
      }
      else {
        if ((playeringame[(int)(origin->FriendPlayer - 1)] & 1U) == 0) {
          local_58 = (AActor *)0x0;
        }
        else {
          local_58 = (&players)[(long)(int)(origin->FriendPlayer - 1) * 0x54];
        }
        local_60 = local_58;
      }
      return local_60;
    }
    if (uVar1 == 0x8000) {
      P_BulletSlope((AActor *)local_48,(FTranslatedLineTarget *)origin,(int)local_38);
      return (AActor *)local_38;
    }
  }
  uVar1 = t._20_4_ & 0x3fc1;
  if (uVar1 == 1) {
    origin_local = (AActor *)0x0;
  }
  else if (uVar1 == 0x40) {
    if ((playeringame[0] & 1U) == 0) {
      local_70 = (AActor *)0x0;
    }
    else {
      local_70 = players;
    }
    origin_local = local_70;
  }
  else if (uVar1 == 0x80) {
    if ((playeringame[1] & 1U) == 0) {
      local_78 = (AActor *)0x0;
    }
    else {
      local_78 = DAT_00d63700;
    }
    origin_local = local_78;
  }
  else if (uVar1 == 0x100) {
    if ((playeringame[2] & 1U) == 0) {
      local_80 = (AActor *)0x0;
    }
    else {
      local_80 = DAT_00d639a0;
    }
    origin_local = local_80;
  }
  else if (uVar1 == 0x200) {
    if ((playeringame[3] & 1U) == 0) {
      local_88 = (AActor *)0x0;
    }
    else {
      local_88 = DAT_00d63c40;
    }
    origin_local = local_88;
  }
  else if (uVar1 == 0x400) {
    if ((playeringame[4] & 1U) == 0) {
      local_90 = (AActor *)0x0;
    }
    else {
      local_90 = DAT_00d63ee0;
    }
    origin_local = local_90;
  }
  else if (uVar1 == 0x800) {
    if ((playeringame[5] & 1U) == 0) {
      local_98 = (AActor *)0x0;
    }
    else {
      local_98 = DAT_00d64180;
    }
    origin_local = local_98;
  }
  else if (uVar1 == 0x1000) {
    if ((playeringame[6] & 1U) == 0) {
      local_a0 = (AActor *)0x0;
    }
    else {
      local_a0 = DAT_00d64420;
    }
    origin_local = local_a0;
  }
  else {
    origin_local = origin;
    if (uVar1 == 0x2000) {
      if ((playeringame[7] & 1U) == 0) {
        local_a8 = (AActor *)0x0;
      }
      else {
        local_a8 = DAT_00d646c0;
      }
      origin_local = local_a8;
    }
  }
  return origin_local;
}

Assistant:

AActor *COPY_AAPTR(AActor *origin, int selector)
{
	if (selector == AAPTR_DEFAULT) return origin;

	FTranslatedLineTarget t;

	if (origin)
	{
		if (origin->player)
		{
			switch (selector & AAPTR_PLAYER_SELECTORS)
			{
			case AAPTR_PLAYER_GETTARGET:
				P_BulletSlope(origin, &t, ALF_PORTALRESTRICT);
				return t.linetarget;

			case AAPTR_PLAYER_GETCONVERSATION:
				return origin->player->ConversationNPC;
			}
		}

		switch (selector & AAPTR_GENERAL_SELECTORS)
		{
		case AAPTR_TARGET: return origin->target;
		case AAPTR_MASTER: return origin->master;
		case AAPTR_TRACER: return origin->tracer;
		case AAPTR_FRIENDPLAYER:
			return origin->FriendPlayer ? AAPTR_RESOLVE_PLAYERNUM(origin->FriendPlayer - 1) : NULL;

		case AAPTR_GET_LINETARGET:
			P_BulletSlope(origin, &t, ALF_PORTALRESTRICT);
			return t.linetarget;
		}
	}

	switch (selector & AAPTR_STATIC_SELECTORS)
	{
		case AAPTR_PLAYER1: return AAPTR_RESOLVE_PLAYERNUM(0);
		case AAPTR_PLAYER2: return AAPTR_RESOLVE_PLAYERNUM(1);
		case AAPTR_PLAYER3: return AAPTR_RESOLVE_PLAYERNUM(2);
		case AAPTR_PLAYER4: return AAPTR_RESOLVE_PLAYERNUM(3);
		case AAPTR_PLAYER5: return AAPTR_RESOLVE_PLAYERNUM(4);
		case AAPTR_PLAYER6: return AAPTR_RESOLVE_PLAYERNUM(5);
		case AAPTR_PLAYER7: return AAPTR_RESOLVE_PLAYERNUM(6);
		case AAPTR_PLAYER8: return AAPTR_RESOLVE_PLAYERNUM(7);
		case AAPTR_NULL: return NULL;
	}

	return origin;
}